

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generic_section.hpp
# Opt level: O3

container<unsigned_char> __thiscall pstore::repo::generic_section::payload(generic_section *this)

{
  container<unsigned_char> cVar1;
  
  if (-1 < (long)this->data_size_) {
    cVar1.end_ = (const_pointer)((long)&this[1].field_0 + this->data_size_);
    cVar1.begin_ = (const_pointer)(this + 1);
    return cVar1;
  }
  assert_failed("end >= begin",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/mcrepo/section.hpp"
                ,0xa9);
}

Assistant:

container<std::uint8_t> payload () const noexcept {
                auto const * const begin = aligned_ptr<std::uint8_t> (this + 1);
                return {begin, begin + data_size_};
            }